

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::SendProxyMessage
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr,string *aUriPath)

{
  undefined4 uVar1;
  int iVar2;
  function<void_(ot::commissioner::Error)> *this_00;
  Error error;
  Address dstAddr;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  ErrorCode local_1b0;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  Address local_168;
  undefined1 local_148 [8];
  _Alloc_hider local_140;
  char local_130 [16];
  _Any_data local_120;
  code *local_110;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  char local_e8 [16];
  Tlv local_d8;
  Message local_b8;
  
  local_1a8 = local_198;
  local_1a0 = 0;
  local_198[0] = 0;
  local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_120,aHandler);
  Address::Set((Error *)local_148,&local_168,aDstAddr);
  uVar1 = local_148._0_4_;
  local_1b0 = local_148._0_4_;
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_140);
  if (local_140._M_p != local_130) {
    operator_delete(local_140._M_p);
  }
  if (uVar1 == kNone) {
    coap::Message::SetUriPath((Error *)local_148,&local_b8,aUriPath);
    uVar1 = local_148._0_4_;
    local_1b0 = local_148._0_4_;
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_140);
    if (local_140._M_p != local_130) {
      operator_delete(local_140._M_p);
    }
    if (uVar1 == kNone) {
      iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
      tlv::Tlv::Tlv(&local_d8,kCommissionerSessionId,(uint16_t)iVar2,kMeshCoP);
      AppendTlv((Error *)local_148,&local_b8,&local_d8);
      uVar1 = local_148._0_4_;
      local_1b0 = local_148._0_4_;
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_140);
      if (local_140._M_p != local_130) {
        operator_delete(local_140._M_p);
      }
      if (local_d8.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.mValue.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (uVar1 == kNone) {
        iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
        if ((char)iVar2 != '\0') {
          SignRequest((Error *)local_148,this,&local_b8,kMeshCoP,true);
          local_1b0 = local_148._0_4_;
          std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_140);
          if (local_140._M_p != local_130) {
            operator_delete(local_140._M_p);
          }
          if (local_148._0_4_ != kNone) goto LAB_001c41b9;
        }
        local_178 = (code *)0x0;
        pcStack_170 = (code *)0x0;
        local_188._M_unused._M_object = (void *)0x0;
        local_188._8_8_ = 0;
        this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
        std::function<void_(ot::commissioner::Error)>::function
                  (this_00,(function<void_(ot::commissioner::Error)> *)&local_120);
        pcStack_170 = std::
                      _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:2403:23)>
                      ::_M_invoke;
        local_178 = std::
                    _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:2403:23)>
                    ::_M_manager;
        local_188._M_unused._M_object = this_00;
        ProxyClient::SendRequest
                  (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_188,&local_168,0xf0bf);
        if (local_178 != (code *)0x0) {
          (*local_178)(&local_188,&local_188,__destroy_functor);
        }
      }
    }
  }
LAB_001c41b9:
  if (local_1b0 != kNone) {
    local_100._0_4_ = local_1b0;
    local_f8._M_p = local_e8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_1a8,local_1a8 + local_1a0);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_100);
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
  }
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_168.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.mBytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  return;
}

Assistant:

void CommissionerImpl::SendProxyMessage(ErrorHandler aHandler, const std::string &aDstAddr, const std::string &aUriPath)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError, /* aStateTlvIsMandatory */ false));
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    SuccessOrExit(error = request.SetUriPath(aUriPath));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}